

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O3

void __thiscall kj::Exception::~Exception(Exception *this)

{
  char *pcVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  if ((this->context).ptr.ptr != (Context *)0x0) {
    (this->context).ptr.ptr = (Context *)0x0;
    (**((this->context).ptr.disposer)->_vptr_Disposer)();
  }
  pcVar1 = (this->description).content.ptr;
  if (pcVar1 != (char *)0x0) {
    sVar2 = (this->description).content.size_;
    (this->description).content.ptr = (char *)0x0;
    (this->description).content.size_ = 0;
    pAVar3 = (this->description).content.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar1,1,sVar2,sVar2,0);
  }
  pcVar1 = (this->ownFile).content.ptr;
  if (pcVar1 != (char *)0x0) {
    sVar2 = (this->ownFile).content.size_;
    pAVar3 = (this->ownFile).content.disposer;
    (this->ownFile).content.ptr = (char *)0x0;
    (this->ownFile).content.size_ = 0;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar1,1,sVar2,sVar2,0);
  }
  return;
}

Assistant:

Exception::~Exception() noexcept {}